

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  BYTE *pBVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  seqDef *psVar12;
  undefined8 uVar13;
  uint uVar14;
  BYTE *pStart_1;
  byte bVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  U32 UVar19;
  BYTE *pInLoopLimit;
  ulong *puVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  BYTE *litLimit_w_1;
  int *piVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  BYTE *pStart_3;
  ulong *puVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  int *piVar37;
  long lVar38;
  BYTE *pStart;
  ulong uVar39;
  int *piVar40;
  uint local_c4;
  BYTE *base;
  BYTE *litLimit_w_6;
  BYTE *ilimit;
  U32 *hashTable;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  size_t stepSize;
  
  pBVar9 = (ms->window).base;
  puVar3 = (ulong *)((long)src + srcSize);
  iVar29 = (int)pBVar9;
  iVar24 = (int)puVar3 - iVar29;
  uVar22 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar7 = (ms->window).dictLimit;
  uVar14 = iVar24 - uVar22;
  if (iVar24 - uVar7 <= uVar22) {
    uVar14 = uVar7;
  }
  if (ms->loadedDictEnd != 0) {
    uVar14 = uVar7;
  }
  piVar25 = (int *)(pBVar9 + uVar14);
  puVar20 = (ulong *)((long)src + (ulong)(piVar25 == (int *)src));
  iVar24 = (int)puVar20 - iVar29;
  uVar34 = iVar24 - uVar22;
  if (iVar24 - uVar7 <= uVar22) {
    uVar34 = uVar7;
  }
  if (ms->loadedDictEnd != 0) {
    uVar34 = uVar7;
  }
  uVar7 = (ms->cParams).targetLength;
  uVar16 = (ulong)(uVar7 + 1 + (uint)(uVar7 == 0));
  puVar17 = (ulong *)((long)src + (srcSize - 8));
  uVar34 = iVar24 - uVar34;
  uVar7 = rep[1];
  local_c4 = uVar7;
  if (uVar34 < uVar7) {
    local_c4 = 0;
  }
  uVar22 = *rep;
  uVar23 = 0;
  if (uVar22 <= uVar34) {
    uVar23 = uVar22;
  }
  puVar27 = (ulong *)((long)src + (ulong)(piVar25 == (int *)src) + 1);
  uVar30 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  if (uVar30 == 5) {
    if (puVar27 < puVar17) {
      bVar15 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = puVar3 + -4;
      do {
        uVar36 = *puVar20 * -0x30e4432345000000 >> (bVar15 & 0x3f);
        uVar39 = *puVar27 * -0x30e4432345000000 >> (bVar15 & 0x3f);
        uVar26 = *puVar20;
        uVar18 = *puVar27;
        uVar21 = (long)puVar20 - (long)pBVar9;
        uVar30 = pUVar10[uVar36];
        uVar8 = pUVar10[uVar39];
        UVar19 = (U32)uVar21;
        pUVar10[uVar36] = UVar19;
        pUVar10[uVar39] = (int)puVar27 - iVar29;
        if ((uVar23 == 0) ||
           (piVar37 = (int *)((long)puVar20 + (2 - (ulong)uVar23)),
           *piVar37 != *(int *)((long)puVar20 + 2))) {
          if (((uVar14 < uVar30) &&
              (piVar37 = (int *)(pBVar9 + uVar30), puVar28 = puVar20, *piVar37 == (int)uVar26)) ||
             ((uVar14 < uVar8 &&
              (piVar37 = (int *)(pBVar9 + uVar8), puVar28 = puVar27, *piVar37 == (int)uVar18)))) {
            uVar30 = (int)puVar28 - (int)piVar37;
            iVar24 = uVar30 + 2;
            uVar26 = 4;
            local_c4 = uVar23;
            if (piVar25 < piVar37) {
              while (src < puVar28) {
                piVar40 = (int *)((long)piVar37 + -1);
                puVar20 = (ulong *)((long)puVar28 + -1);
                if ((*(char *)puVar20 != *(char *)piVar40) ||
                   (uVar26 = uVar26 + 1, puVar28 = puVar20, piVar37 = piVar40, piVar40 <= piVar25))
                break;
              }
            }
            goto LAB_001c7962;
          }
          lVar38 = ((ulong)((long)puVar20 - (long)src) >> 7) + uVar16;
          puVar20 = (ulong *)((long)puVar20 + lVar38);
          puVar27 = (ulong *)((long)puVar27 + lVar38);
        }
        else {
          uVar18 = (ulong)(*(char *)((long)puVar20 + 1) == *(char *)((long)piVar37 + -1));
          uVar26 = uVar18 | 4;
          iVar24 = 0;
          puVar28 = (ulong *)((long)puVar20 + (2 - uVar18));
          piVar37 = (int *)((long)piVar37 - uVar18);
          uVar30 = uVar23;
LAB_001c7962:
          uVar23 = uVar30;
          puVar20 = (ulong *)((long)puVar28 + uVar26);
          puVar32 = (ulong *)((long)piVar37 + uVar26);
          puVar27 = puVar20;
          if (puVar20 < puVar1) {
            uVar36 = *puVar20 ^ *puVar32;
            uVar18 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            if (*puVar32 == *puVar20) {
              do {
                puVar27 = puVar27 + 1;
                puVar32 = puVar32 + 1;
                if (puVar1 <= puVar27) goto LAB_001c79d6;
                uVar36 = *puVar27 ^ *puVar32;
                uVar18 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (long)puVar27 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar20);
              } while (*puVar32 == *puVar27);
            }
          }
          else {
LAB_001c79d6:
            if ((puVar27 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar27 < (ulong *)((long)puVar3 - 1U)) && ((short)*puVar32 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar27 < puVar3) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar32 == (char)*puVar27));
            }
            uVar18 = (long)puVar27 - (long)puVar20;
          }
          uVar36 = (long)puVar28 - (long)src;
          if (puVar2 < puVar28) {
            puVar27 = (ulong *)seqStore->lit;
            puVar20 = puVar27;
            puVar32 = (ulong *)src;
            if (src <= puVar2) {
              puVar20 = (ulong *)((long)puVar27 + ((long)puVar2 - (long)src));
              uVar39 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar39;
              puVar32 = puVar2;
              if (0x10 < (long)puVar2 - (long)src) {
                lVar38 = 0x10;
                do {
                  uVar13 = ((undefined8 *)((long)src + lVar38))[1];
                  puVar4 = (undefined8 *)((long)puVar27 + lVar38);
                  *puVar4 = *(undefined8 *)((long)src + lVar38);
                  puVar4[1] = uVar13;
                  puVar5 = (undefined8 *)((long)src + lVar38 + 0x10);
                  uVar13 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (puVar4 + 4 < puVar20);
              }
            }
            if (puVar32 < puVar28) {
              lVar38 = 0;
              do {
                *(undefined1 *)((long)puVar20 + lVar38) = *(undefined1 *)((long)puVar32 + lVar38);
                lVar38 = lVar38 + 1;
              } while ((long)puVar28 - (long)puVar32 != lVar38);
            }
          }
          else {
            puVar20 = (ulong *)seqStore->lit;
            uVar39 = *(ulong *)((long)src + 8);
            *puVar20 = *src;
            puVar20[1] = uVar39;
            if (0x10 < uVar36) {
              pBVar11 = seqStore->lit;
              uVar39 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar11 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar11 + 0x18) = uVar39;
              if (0x20 < (long)uVar36) {
                lVar38 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x20);
                  uVar13 = puVar4[1];
                  pBVar6 = pBVar11 + lVar38 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar4;
                  *(undefined8 *)(pBVar6 + 8) = uVar13;
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x30);
                  uVar13 = puVar4[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (pBVar6 + 0x20 < pBVar11 + uVar36);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar39 = (uVar18 + uVar26) - 3;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar36;
          psVar12->offset = iVar24 + 1;
          if (0xffff < uVar39) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)uVar39;
          seqStore->sequences = psVar12 + 1;
          puVar20 = (ulong *)((long)puVar28 + uVar18 + uVar26);
          if (puVar20 <= puVar17) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar21 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar15 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)puVar20 + -2) * -0x30e4432345000000) >> (bVar15 & 0x3f)]
                 = ((int)puVar20 + -2) - iVar29;
            uVar30 = local_c4;
            if (local_c4 == 0) {
              local_c4 = 0;
            }
            else {
              for (; (local_c4 = uVar30, puVar20 <= puVar17 &&
                     (uVar26 = (ulong)local_c4, (int)*puVar20 == *(int *)((long)puVar20 - uVar26)));
                  puVar20 = (ulong *)((long)puVar20 + uVar18 + 4)) {
                puVar27 = (ulong *)((long)puVar20 + 4);
                puVar32 = (ulong *)((long)puVar20 + (4 - uVar26));
                puVar28 = puVar27;
                if (puVar27 < puVar1) {
                  uVar21 = *puVar27 ^ *puVar32;
                  uVar18 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                  if (*puVar32 == *puVar27) {
                    puVar28 = (ulong *)((long)puVar20 + 0xc);
                    puVar32 = (ulong *)((long)puVar20 + (0xc - uVar26));
                    do {
                      if (puVar1 <= puVar28) goto LAB_001c7c7c;
                      uVar26 = *puVar32;
                      uVar21 = *puVar28;
                      uVar36 = uVar21 ^ uVar26;
                      uVar18 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      uVar18 = (long)puVar28 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar27);
                      puVar28 = puVar28 + 1;
                      puVar32 = puVar32 + 1;
                    } while (uVar26 == uVar21);
                  }
                }
                else {
LAB_001c7c7c:
                  if ((puVar28 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar28))
                  {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar28 < (ulong *)((long)puVar3 - 1U)) &&
                     ((short)*puVar32 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar28 < puVar3) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar32 == (char)*puVar28));
                  }
                  uVar18 = (long)puVar28 - (long)puVar27;
                }
                pUVar10[*puVar20 * -0x30e4432345000000 >> (bVar15 & 0x3f)] = (int)puVar20 - iVar29;
                if (puVar20 <= puVar2) {
                  puVar27 = (ulong *)seqStore->lit;
                  uVar26 = puVar20[1];
                  *puVar27 = *puVar20;
                  puVar27[1] = uVar26;
                }
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < uVar18 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(uVar18 + 1);
                seqStore->sequences = psVar12 + 1;
                uVar30 = uVar23;
                uVar23 = local_c4;
              }
            }
          }
          puVar27 = (ulong *)((long)puVar20 + 1);
          src = puVar20;
        }
      } while (puVar27 < puVar17);
    }
  }
  else if (uVar30 == 6) {
    if (puVar27 < puVar17) {
      bVar15 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = puVar3 + -4;
      do {
        uVar39 = *puVar20 * -0x30e4432340650000 >> (bVar15 & 0x3f);
        uVar36 = *puVar27 * -0x30e4432340650000 >> (bVar15 & 0x3f);
        uVar26 = *puVar20;
        uVar18 = *puVar27;
        uVar21 = (long)puVar20 - (long)pBVar9;
        uVar30 = pUVar10[uVar39];
        uVar8 = pUVar10[uVar36];
        UVar19 = (U32)uVar21;
        pUVar10[uVar39] = UVar19;
        pUVar10[uVar36] = (int)puVar27 - iVar29;
        if ((uVar23 == 0) ||
           (piVar37 = (int *)((long)puVar20 + (2 - (ulong)uVar23)),
           *piVar37 != *(int *)((long)puVar20 + 2))) {
          if (((uVar14 < uVar30) &&
              (piVar37 = (int *)(pBVar9 + uVar30), puVar28 = puVar20, *piVar37 == (int)uVar26)) ||
             ((uVar14 < uVar8 &&
              (piVar37 = (int *)(pBVar9 + uVar8), puVar28 = puVar27, *piVar37 == (int)uVar18)))) {
            uVar30 = (int)puVar28 - (int)piVar37;
            iVar24 = uVar30 + 2;
            uVar26 = 4;
            local_c4 = uVar23;
            if (piVar25 < piVar37) {
              while (src < puVar28) {
                piVar40 = (int *)((long)piVar37 + -1);
                puVar20 = (ulong *)((long)puVar28 + -1);
                if ((*(char *)puVar20 != *(char *)piVar40) ||
                   (uVar26 = uVar26 + 1, puVar28 = puVar20, piVar37 = piVar40, piVar40 <= piVar25))
                break;
              }
            }
            goto LAB_001c72d8;
          }
          lVar38 = ((ulong)((long)puVar20 - (long)src) >> 7) + uVar16;
          puVar20 = (ulong *)((long)puVar20 + lVar38);
          puVar27 = (ulong *)((long)puVar27 + lVar38);
        }
        else {
          uVar26 = (ulong)(*(char *)((long)puVar20 + 1) == *(char *)((long)piVar37 + -1));
          puVar28 = (ulong *)((long)puVar20 + (2 - uVar26));
          piVar37 = (int *)((long)piVar37 - uVar26);
          uVar26 = uVar26 | 4;
          iVar24 = 0;
          uVar30 = uVar23;
LAB_001c72d8:
          puVar20 = (ulong *)((long)puVar28 + uVar26);
          puVar32 = (ulong *)((long)piVar37 + uVar26);
          puVar27 = puVar20;
          if (puVar20 < puVar1) {
            uVar36 = *puVar20 ^ *puVar32;
            uVar18 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            if (*puVar32 == *puVar20) {
              do {
                puVar27 = puVar27 + 1;
                puVar32 = puVar32 + 1;
                if (puVar1 <= puVar27) goto LAB_001c7403;
                uVar36 = *puVar27 ^ *puVar32;
                uVar18 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (long)puVar27 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar20);
              } while (*puVar32 == *puVar27);
            }
          }
          else {
LAB_001c7403:
            if ((puVar27 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar27 < (ulong *)((long)puVar3 - 1U)) && ((short)*puVar32 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar27 < puVar3) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar32 == (char)*puVar27));
            }
            uVar18 = (long)puVar27 - (long)puVar20;
          }
          uVar36 = (long)puVar28 - (long)src;
          if (puVar2 < puVar28) {
            puVar27 = (ulong *)seqStore->lit;
            puVar20 = puVar27;
            puVar32 = (ulong *)src;
            if (src <= puVar2) {
              puVar20 = (ulong *)((long)puVar27 + ((long)puVar2 - (long)src));
              uVar39 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar39;
              puVar32 = puVar2;
              if (0x10 < (long)puVar2 - (long)src) {
                lVar38 = 0x10;
                do {
                  uVar13 = ((undefined8 *)((long)src + lVar38))[1];
                  puVar4 = (undefined8 *)((long)puVar27 + lVar38);
                  *puVar4 = *(undefined8 *)((long)src + lVar38);
                  puVar4[1] = uVar13;
                  puVar5 = (undefined8 *)((long)src + lVar38 + 0x10);
                  uVar13 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (puVar4 + 4 < puVar20);
              }
            }
            if (puVar32 < puVar28) {
              lVar38 = 0;
              do {
                *(undefined1 *)((long)puVar20 + lVar38) = *(undefined1 *)((long)puVar32 + lVar38);
                lVar38 = lVar38 + 1;
              } while ((long)puVar28 - (long)puVar32 != lVar38);
            }
          }
          else {
            puVar20 = (ulong *)seqStore->lit;
            uVar39 = *(ulong *)((long)src + 8);
            *puVar20 = *src;
            puVar20[1] = uVar39;
            if (0x10 < uVar36) {
              pBVar11 = seqStore->lit;
              uVar39 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar11 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar11 + 0x18) = uVar39;
              if (0x20 < (long)uVar36) {
                lVar38 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x20);
                  uVar13 = puVar4[1];
                  pBVar6 = pBVar11 + lVar38 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar4;
                  *(undefined8 *)(pBVar6 + 8) = uVar13;
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x30);
                  uVar13 = puVar4[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (pBVar6 + 0x20 < pBVar11 + uVar36);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar39 = (uVar18 + uVar26) - 3;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar36;
          psVar12->offset = iVar24 + 1;
          if (0xffff < uVar39) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)uVar39;
          seqStore->sequences = psVar12 + 1;
          puVar20 = (ulong *)((long)puVar28 + uVar18 + uVar26);
          uVar23 = uVar30;
          if (puVar20 <= puVar17) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar21 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar15 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)puVar20 + -2) * -0x30e4432340650000) >> (bVar15 & 0x3f)]
                 = ((int)puVar20 + -2) - iVar29;
            uVar8 = local_c4;
            if (local_c4 == 0) {
              local_c4 = 0;
            }
            else {
              for (; (local_c4 = uVar8, uVar23 = uVar30, puVar20 <= puVar17 &&
                     (uVar26 = (ulong)local_c4, (int)*puVar20 == *(int *)((long)puVar20 - uVar26)));
                  puVar20 = (ulong *)((long)puVar20 + uVar18 + 4)) {
                puVar27 = (ulong *)((long)puVar20 + 4);
                puVar32 = (ulong *)((long)puVar20 + (4 - uVar26));
                puVar28 = puVar27;
                if (puVar27 < puVar1) {
                  uVar21 = *puVar27 ^ *puVar32;
                  uVar18 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                  if (*puVar32 == *puVar27) {
                    puVar28 = (ulong *)((long)puVar20 + 0xc);
                    puVar32 = (ulong *)((long)puVar20 + (0xc - uVar26));
                    do {
                      if (puVar1 <= puVar28) goto LAB_001c76be;
                      uVar26 = *puVar32;
                      uVar21 = *puVar28;
                      uVar36 = uVar21 ^ uVar26;
                      uVar18 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      uVar18 = (long)puVar28 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar27);
                      puVar28 = puVar28 + 1;
                      puVar32 = puVar32 + 1;
                    } while (uVar26 == uVar21);
                  }
                }
                else {
LAB_001c76be:
                  if ((puVar28 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar28))
                  {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar28 < (ulong *)((long)puVar3 - 1U)) &&
                     ((short)*puVar32 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar28 < puVar3) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar32 == (char)*puVar28));
                  }
                  uVar18 = (long)puVar28 - (long)puVar27;
                }
                pUVar10[*puVar20 * -0x30e4432340650000 >> (bVar15 & 0x3f)] = (int)puVar20 - iVar29;
                if (puVar20 <= puVar2) {
                  puVar27 = (ulong *)seqStore->lit;
                  uVar26 = puVar20[1];
                  *puVar27 = *puVar20;
                  puVar27[1] = uVar26;
                }
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < uVar18 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(uVar18 + 1);
                seqStore->sequences = psVar12 + 1;
                uVar8 = uVar30;
                uVar30 = local_c4;
              }
            }
          }
          puVar27 = (ulong *)((long)puVar20 + 1);
          src = puVar20;
        }
      } while (puVar27 < puVar17);
    }
  }
  else if (uVar30 == 7) {
    if (puVar27 < puVar17) {
      bVar15 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar3 - 7);
      puVar2 = puVar3 + -4;
      do {
        uVar39 = *puVar20 * -0x30e44323405a9d00 >> (bVar15 & 0x3f);
        uVar36 = *puVar27 * -0x30e44323405a9d00 >> (bVar15 & 0x3f);
        uVar26 = *puVar20;
        uVar18 = *puVar27;
        uVar21 = (long)puVar20 - (long)pBVar9;
        uVar30 = pUVar10[uVar39];
        uVar8 = pUVar10[uVar36];
        UVar19 = (U32)uVar21;
        pUVar10[uVar39] = UVar19;
        pUVar10[uVar36] = (int)puVar27 - iVar29;
        if ((uVar23 == 0) ||
           (piVar37 = (int *)((long)puVar20 + (2 - (ulong)uVar23)),
           *piVar37 != *(int *)((long)puVar20 + 2))) {
          if (((uVar14 < uVar30) &&
              (piVar37 = (int *)(pBVar9 + uVar30), puVar28 = puVar20, *piVar37 == (int)uVar26)) ||
             ((uVar14 < uVar8 &&
              (piVar37 = (int *)(pBVar9 + uVar8), puVar28 = puVar27, *piVar37 == (int)uVar18)))) {
            uVar30 = (int)puVar28 - (int)piVar37;
            iVar24 = uVar30 + 2;
            uVar26 = 4;
            local_c4 = uVar23;
            if (piVar25 < piVar37) {
              while (src < puVar28) {
                piVar40 = (int *)((long)piVar37 + -1);
                puVar20 = (ulong *)((long)puVar28 + -1);
                if ((*(char *)puVar20 != *(char *)piVar40) ||
                   (uVar26 = uVar26 + 1, puVar28 = puVar20, piVar37 = piVar40, piVar40 <= piVar25))
                break;
              }
            }
            goto LAB_001c6dcb;
          }
          lVar38 = ((ulong)((long)puVar20 - (long)src) >> 7) + uVar16;
          puVar20 = (ulong *)((long)puVar20 + lVar38);
          puVar27 = (ulong *)((long)puVar27 + lVar38);
        }
        else {
          uVar18 = (ulong)(*(char *)((long)puVar20 + 1) == *(char *)((long)piVar37 + -1));
          uVar26 = uVar18 | 4;
          iVar24 = 0;
          puVar28 = (ulong *)((long)puVar20 + (2 - uVar18));
          piVar37 = (int *)((long)piVar37 - uVar18);
          uVar30 = uVar23;
LAB_001c6dcb:
          puVar20 = (ulong *)((long)puVar28 + uVar26);
          puVar32 = (ulong *)((long)piVar37 + uVar26);
          puVar27 = puVar20;
          if (puVar20 < puVar1) {
            uVar36 = *puVar20 ^ *puVar32;
            uVar18 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            if (*puVar32 == *puVar20) {
              do {
                puVar27 = puVar27 + 1;
                puVar32 = puVar32 + 1;
                if (puVar1 <= puVar27) goto LAB_001c6e3a;
                uVar36 = *puVar27 ^ *puVar32;
                uVar18 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = (long)puVar27 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar20);
              } while (*puVar32 == *puVar27);
            }
          }
          else {
LAB_001c6e3a:
            if ((puVar27 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar27 < (ulong *)((long)puVar3 - 1U)) && ((short)*puVar32 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar27 < puVar3) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar32 == (char)*puVar27));
            }
            uVar18 = (long)puVar27 - (long)puVar20;
          }
          uVar36 = (long)puVar28 - (long)src;
          if (puVar2 < puVar28) {
            puVar27 = (ulong *)seqStore->lit;
            puVar20 = puVar27;
            puVar32 = (ulong *)src;
            if (src <= puVar2) {
              puVar20 = (ulong *)((long)puVar27 + ((long)puVar2 - (long)src));
              uVar39 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar39;
              puVar32 = puVar2;
              if (0x10 < (long)puVar2 - (long)src) {
                lVar38 = 0x10;
                do {
                  uVar13 = ((undefined8 *)((long)src + lVar38))[1];
                  puVar4 = (undefined8 *)((long)puVar27 + lVar38);
                  *puVar4 = *(undefined8 *)((long)src + lVar38);
                  puVar4[1] = uVar13;
                  puVar5 = (undefined8 *)((long)src + lVar38 + 0x10);
                  uVar13 = puVar5[1];
                  puVar4[2] = *puVar5;
                  puVar4[3] = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (puVar4 + 4 < puVar20);
              }
            }
            if (puVar32 < puVar28) {
              lVar38 = 0;
              do {
                *(undefined1 *)((long)puVar20 + lVar38) = *(undefined1 *)((long)puVar32 + lVar38);
                lVar38 = lVar38 + 1;
              } while ((long)puVar28 - (long)puVar32 != lVar38);
            }
          }
          else {
            puVar20 = (ulong *)seqStore->lit;
            uVar39 = *(ulong *)((long)src + 8);
            *puVar20 = *src;
            puVar20[1] = uVar39;
            if (0x10 < uVar36) {
              pBVar11 = seqStore->lit;
              uVar39 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar11 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar11 + 0x18) = uVar39;
              if (0x20 < (long)uVar36) {
                lVar38 = 0;
                do {
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x20);
                  uVar13 = puVar4[1];
                  pBVar6 = pBVar11 + lVar38 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar4;
                  *(undefined8 *)(pBVar6 + 8) = uVar13;
                  puVar4 = (undefined8 *)((long)src + lVar38 + 0x30);
                  uVar13 = puVar4[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar4;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (pBVar6 + 0x20 < pBVar11 + uVar36);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar36;
          if (0xffff < uVar36) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar39 = (uVar18 + uVar26) - 3;
          psVar12 = seqStore->sequences;
          psVar12->litLength = (U16)uVar36;
          psVar12->offset = iVar24 + 1;
          if (0xffff < uVar39) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar12->matchLength = (U16)uVar39;
          seqStore->sequences = psVar12 + 1;
          puVar20 = (ulong *)((long)puVar28 + uVar18 + uVar26);
          uVar23 = uVar30;
          if (puVar20 <= puVar17) {
            pUVar10[(ulong)(*(long *)(pBVar9 + (uVar21 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar15 & 0x3f)] = UVar19 + 2;
            pUVar10[(ulong)(*(long *)((long)puVar20 + -2) * -0x30e44323405a9d00) >> (bVar15 & 0x3f)]
                 = ((int)puVar20 + -2) - iVar29;
            uVar8 = local_c4;
            if (local_c4 == 0) {
              local_c4 = 0;
            }
            else {
              for (; (local_c4 = uVar8, uVar23 = uVar30, puVar20 <= puVar17 &&
                     (uVar26 = (ulong)local_c4, (int)*puVar20 == *(int *)((long)puVar20 - uVar26)));
                  puVar20 = (ulong *)((long)puVar20 + uVar18 + 4)) {
                puVar27 = (ulong *)((long)puVar20 + 4);
                puVar32 = (ulong *)((long)puVar20 + (4 - uVar26));
                puVar28 = puVar27;
                if (puVar27 < puVar1) {
                  uVar21 = *puVar27 ^ *puVar32;
                  uVar18 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                  if (*puVar32 == *puVar27) {
                    puVar28 = (ulong *)((long)puVar20 + 0xc);
                    puVar32 = (ulong *)((long)puVar20 + (0xc - uVar26));
                    do {
                      if (puVar1 <= puVar28) goto LAB_001c70e4;
                      uVar26 = *puVar32;
                      uVar21 = *puVar28;
                      uVar36 = uVar21 ^ uVar26;
                      uVar18 = 0;
                      if (uVar36 != 0) {
                        for (; (uVar36 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      uVar18 = (long)puVar28 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar27);
                      puVar28 = puVar28 + 1;
                      puVar32 = puVar32 + 1;
                    } while (uVar26 == uVar21);
                  }
                }
                else {
LAB_001c70e4:
                  if ((puVar28 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar28))
                  {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar32 = (ulong *)((long)puVar32 + 4);
                  }
                  if ((puVar28 < (ulong *)((long)puVar3 - 1U)) &&
                     ((short)*puVar32 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar32 = (ulong *)((long)puVar32 + 2);
                  }
                  if (puVar28 < puVar3) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar32 == (char)*puVar28));
                  }
                  uVar18 = (long)puVar28 - (long)puVar27;
                }
                pUVar10[*puVar20 * -0x30e44323405a9d00 >> (bVar15 & 0x3f)] = (int)puVar20 - iVar29;
                if (puVar20 <= puVar2) {
                  puVar27 = (ulong *)seqStore->lit;
                  uVar26 = puVar20[1];
                  *puVar27 = *puVar20;
                  puVar27[1] = uVar26;
                }
                psVar12 = seqStore->sequences;
                psVar12->litLength = 0;
                psVar12->offset = 1;
                if (0xffff < uVar18 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar12->matchLength = (U16)(uVar18 + 1);
                seqStore->sequences = psVar12 + 1;
                uVar8 = uVar30;
                uVar30 = local_c4;
              }
            }
          }
          puVar27 = (ulong *)((long)puVar20 + 1);
          src = puVar20;
        }
      } while (puVar27 < puVar17);
    }
  }
  else if (puVar27 < puVar17) {
    bVar15 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar3 - 7);
    puVar2 = puVar3 + -4;
    do {
      uVar26 = *puVar20;
      uVar31 = (uint)((int)uVar26 * -0x61c8864f) >> (bVar15 & 0x1f);
      uVar18 = *puVar27;
      uVar35 = (uint)((int)uVar18 * -0x61c8864f) >> (bVar15 & 0x1f);
      uVar21 = (long)puVar20 - (long)pBVar9;
      uVar30 = pUVar10[uVar31];
      uVar8 = pUVar10[uVar35];
      UVar19 = (U32)uVar21;
      pUVar10[uVar31] = UVar19;
      pUVar10[uVar35] = (int)puVar27 - iVar29;
      if ((uVar23 == 0) ||
         (piVar37 = (int *)((long)puVar20 + (2 - (ulong)uVar23)),
         *piVar37 != *(int *)((long)puVar20 + 2))) {
        if (((uVar14 < uVar30) &&
            (piVar37 = (int *)(pBVar9 + uVar30), puVar28 = puVar20, *piVar37 == (int)uVar26)) ||
           ((uVar14 < uVar8 &&
            (piVar37 = (int *)(pBVar9 + uVar8), puVar28 = puVar27, *piVar37 == (int)uVar18)))) {
          uVar30 = (int)puVar28 - (int)piVar37;
          uVar26 = (ulong)uVar30;
          iVar24 = uVar30 + 2;
          uVar18 = 4;
          local_c4 = uVar23;
          if (piVar25 < piVar37) {
            while (src < puVar28) {
              piVar40 = (int *)((long)piVar37 + -1);
              puVar20 = (ulong *)((long)puVar28 + -1);
              if ((*(char *)puVar20 != *(char *)piVar40) ||
                 (uVar18 = uVar18 + 1, puVar28 = puVar20, piVar37 = piVar40, piVar40 <= piVar25))
              break;
            }
          }
          goto LAB_001c7f29;
        }
        lVar38 = ((ulong)((long)puVar20 - (long)src) >> 7) + uVar16;
        puVar20 = (ulong *)((long)puVar20 + lVar38);
        puVar27 = (ulong *)((long)puVar27 + lVar38);
      }
      else {
        uVar36 = (ulong)(*(char *)((long)puVar20 + 1) == *(char *)((long)piVar37 + -1));
        uVar18 = uVar36 | 4;
        iVar24 = 0;
        uVar26 = (ulong)uVar23;
        puVar28 = (ulong *)((long)puVar20 + (2 - uVar36));
        piVar37 = (int *)((long)piVar37 - uVar36);
LAB_001c7f29:
        uVar23 = (uint)uVar26;
        puVar20 = (ulong *)((long)puVar28 + uVar18);
        puVar32 = (ulong *)((long)piVar37 + uVar18);
        puVar27 = puVar20;
        if (puVar20 < puVar1) {
          uVar39 = *puVar20 ^ *puVar32;
          uVar36 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = uVar36 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar20) {
            do {
              puVar27 = puVar27 + 1;
              puVar32 = puVar32 + 1;
              if (puVar1 <= puVar27) goto LAB_001c7f98;
              uVar39 = *puVar27 ^ *puVar32;
              uVar36 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar36 = (long)puVar27 + ((uVar36 >> 3 & 0x1fffffff) - (long)puVar20);
            } while (*puVar32 == *puVar27);
          }
        }
        else {
LAB_001c7f98:
          if ((puVar27 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar27 < (ulong *)((long)puVar3 - 1U)) && ((short)*puVar32 == (short)*puVar27)) {
            puVar27 = (ulong *)((long)puVar27 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar27 < puVar3) {
            puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar32 == (char)*puVar27));
          }
          uVar36 = (long)puVar27 - (long)puVar20;
        }
        uVar39 = (long)puVar28 - (long)src;
        if (puVar2 < puVar28) {
          puVar27 = (ulong *)seqStore->lit;
          puVar20 = puVar27;
          puVar32 = (ulong *)src;
          if (src <= puVar2) {
            puVar20 = (ulong *)((long)puVar27 + ((long)puVar2 - (long)src));
            uVar33 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar33;
            puVar32 = puVar2;
            if (0x10 < (long)puVar2 - (long)src) {
              lVar38 = 0x10;
              do {
                uVar13 = ((undefined8 *)((long)src + lVar38))[1];
                puVar4 = (undefined8 *)((long)puVar27 + lVar38);
                *puVar4 = *(undefined8 *)((long)src + lVar38);
                puVar4[1] = uVar13;
                puVar5 = (undefined8 *)((long)src + lVar38 + 0x10);
                uVar13 = puVar5[1];
                puVar4[2] = *puVar5;
                puVar4[3] = uVar13;
                lVar38 = lVar38 + 0x20;
              } while (puVar4 + 4 < puVar20);
            }
          }
          if (puVar32 < puVar28) {
            lVar38 = 0;
            do {
              *(undefined1 *)((long)puVar20 + lVar38) = *(undefined1 *)((long)puVar32 + lVar38);
              lVar38 = lVar38 + 1;
            } while ((long)puVar28 - (long)puVar32 != lVar38);
          }
        }
        else {
          puVar20 = (ulong *)seqStore->lit;
          uVar33 = *(ulong *)((long)src + 8);
          *puVar20 = *src;
          puVar20[1] = uVar33;
          if (0x10 < uVar39) {
            pBVar11 = seqStore->lit;
            uVar33 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar11 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar11 + 0x18) = uVar33;
            if (0x20 < (long)uVar39) {
              lVar38 = 0;
              do {
                puVar4 = (undefined8 *)((long)src + lVar38 + 0x20);
                uVar13 = puVar4[1];
                pBVar6 = pBVar11 + lVar38 + 0x20;
                *(undefined8 *)pBVar6 = *puVar4;
                *(undefined8 *)(pBVar6 + 8) = uVar13;
                puVar4 = (undefined8 *)((long)src + lVar38 + 0x30);
                uVar13 = puVar4[1];
                *(undefined8 *)(pBVar6 + 0x10) = *puVar4;
                *(undefined8 *)(pBVar6 + 0x18) = uVar13;
                lVar38 = lVar38 + 0x20;
              } while (pBVar6 + 0x20 < pBVar11 + uVar39);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar39;
        if (0xffff < uVar39) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        uVar33 = (uVar36 + uVar18) - 3;
        psVar12 = seqStore->sequences;
        psVar12->litLength = (U16)uVar39;
        psVar12->offset = iVar24 + 1;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar12->matchLength = (U16)uVar33;
        seqStore->sequences = psVar12 + 1;
        puVar20 = (ulong *)((long)puVar28 + uVar36 + uVar18);
        if (puVar20 <= puVar17) {
          pUVar10[(uint)(*(int *)(pBVar9 + (uVar21 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar15 & 0x1f)] = UVar19 + 2;
          pUVar10[(uint)(*(int *)((long)puVar20 + -2) * -0x61c8864f) >> (bVar15 & 0x1f)] =
               ((int)puVar20 + -2) - iVar29;
          uVar30 = local_c4;
          if (local_c4 == 0) {
            local_c4 = 0;
          }
          else {
            while (local_c4 = uVar30, puVar20 <= puVar17) {
              uVar18 = (ulong)local_c4;
              uVar23 = (uint)uVar26;
              if ((int)*puVar20 != *(int *)((long)puVar20 - uVar18)) break;
              puVar27 = (ulong *)((long)puVar20 + 4);
              puVar32 = (ulong *)((long)puVar20 + (4 - uVar18));
              puVar28 = puVar27;
              if (puVar27 < puVar1) {
                uVar21 = *puVar27 ^ *puVar32;
                uVar26 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
                if (*puVar32 == *puVar27) {
                  puVar28 = (ulong *)((long)puVar20 + 0xc);
                  puVar32 = (ulong *)((long)puVar20 + (0xc - uVar18));
                  do {
                    if (puVar1 <= puVar28) goto LAB_001c8224;
                    uVar21 = *puVar32;
                    uVar36 = *puVar28;
                    uVar39 = uVar36 ^ uVar21;
                    uVar26 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = (long)puVar28 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar27);
                    puVar28 = puVar28 + 1;
                    puVar32 = puVar32 + 1;
                  } while (uVar21 == uVar36);
                }
              }
              else {
LAB_001c8224:
                if ((puVar28 < (ulong *)((long)puVar3 - 3U)) && ((int)*puVar32 == (int)*puVar28)) {
                  puVar28 = (ulong *)((long)puVar28 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar28 < (ulong *)((long)puVar3 - 1U)) && ((short)*puVar32 == (short)*puVar28)
                   ) {
                  puVar28 = (ulong *)((long)puVar28 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar28 < puVar3) {
                  puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar32 == (char)*puVar28));
                }
                uVar26 = (long)puVar28 - (long)puVar27;
              }
              pUVar10[(uint)((int)*puVar20 * -0x61c8864f) >> (bVar15 & 0x1f)] =
                   (int)puVar20 - iVar29;
              if (puVar20 <= puVar2) {
                puVar27 = (ulong *)seqStore->lit;
                uVar21 = puVar20[1];
                *puVar27 = *puVar20;
                puVar27[1] = uVar21;
              }
              psVar12 = seqStore->sequences;
              psVar12->litLength = 0;
              psVar12->offset = 1;
              if (0xffff < uVar26 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar12 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar12->matchLength = (U16)(uVar26 + 1);
              seqStore->sequences = psVar12 + 1;
              puVar20 = (ulong *)((long)puVar20 + uVar26 + 4);
              uVar26 = uVar18;
              uVar30 = uVar23;
              uVar23 = local_c4;
            }
          }
        }
        puVar27 = (ulong *)((long)puVar20 + 1);
        src = puVar20;
      }
    } while (puVar27 < puVar17);
  }
  uVar14 = 0;
  if (uVar34 < uVar7) {
    uVar14 = uVar7;
  }
  if (uVar34 < uVar22) {
    uVar14 = uVar22;
  }
  if (uVar23 == 0) {
    uVar23 = uVar14;
  }
  if (local_c4 != 0) {
    uVar14 = local_c4;
  }
  *rep = uVar23;
  rep[1] = uVar14;
  return (long)puVar3 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}